

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execJsr<(moira::Instr)66,(moira::Mode)7,(moira::Size)4>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 uVar2;
  ushort in_SI;
  Moira *in_RDI;
  AEStackFrame frame;
  bool error;
  int delay [12];
  u32 ea;
  int src;
  undefined7 in_stack_ffffffffffffff90;
  byte in_stack_ffffffffffffff97;
  AEStackFrame in_stack_ffffffffffffff98;
  undefined1 auVar3 [12];
  undefined1 local_48 [20];
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_24;
  undefined4 local_20;
  u32 local_14;
  uint local_10;
  
  local_10 = in_SI & 7;
  local_14 = computeEA<(moira::Mode)7,(moira::Size)4,2ul>
                       ((Moira *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                        (u32)((ulong)in_RDI >> 0x20));
  memset(local_48,0,0x30);
  local_34 = 2;
  local_30 = 4;
  local_2c = 2;
  local_24 = 2;
  local_20 = 4;
  (*in_RDI->_vptr_Moira[0x19])(in_RDI,2);
  bVar1 = isDspMode(MODE_AW);
  if ((bVar1) && (bVar1 = misaligned<(moira::Size)2>(in_RDI,local_14), bVar1)) {
    makeFrame<0ul>(in_stack_ffffffffffffff98._8_8_,in_stack_ffffffffffffff98.addr);
    execAddressError((Moira *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff98,(int)((ulong)in_RDI >> 0x20));
  }
  else {
    auVar3 = in_stack_ffffffffffffff98._4_12_;
    bVar1 = isAbsMode(MODE_AW);
    if ((bVar1) || (bVar1 = isDspMode(MODE_AW), bVar1)) {
      (in_RDI->reg).pc = (in_RDI->reg).pc + 2;
    }
    bVar1 = misaligned<(moira::Size)2>(in_RDI,local_14);
    if (bVar1) {
      frame = makeFrame<0ul>(auVar3._4_8_,auVar3._0_4_);
      execAddressError((Moira *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),frame,
                       (int)((ulong)in_RDI >> 0x20));
    }
    else {
      push<(moira::Size)4,0ul>
                ((Moira *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                 (u32)((ulong)in_RDI >> 0x20),(bool *)0x276a8d);
      if ((in_stack_ffffffffffffff97 & 1) == 0) {
        (in_RDI->reg).pc = local_14;
        uVar2 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>
                          ((Moira *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                           (u32)((ulong)in_RDI >> 0x20));
        (in_RDI->queue).irc = (u16)uVar2;
        prefetch<4ul>((Moira *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
      }
    }
  }
  return;
}

Assistant:

void
Moira::execJsr(u16 opcode)
{
    int src = _____________xxx(opcode);
    u32 ea  = computeEA<M, Long, SKIP_LAST_READ>(src);
    
    const int delay[] = { 0,0,0,0,0,2,4,2,0,2,4,0 };
    sync(delay[M]);

    /*
    if (M == 5) {
        int x = (i16)queue.irc;
        printf("JSR $%s%x(a%d) [a%d = %x] ea = %x\n", x<0?"-":"", x<0?-(unsigned)x:x, src, src, reg.a[src], ea);
    }
    */
    
    // Check for address error in displacement modes
    if (isDspMode(M) && misaligned<Word>(ea)) {
        execAddressError(makeFrame(ea));
        return;
    }

    // Update program counter
    if (isAbsMode(M) || isDspMode(M)) reg.pc += 2;

    // Check for address error in all other modes
    if (misaligned<Word>(ea)) {
        execAddressError(makeFrame(ea));
        return;
    }

    // Save return address on stack
    bool error;
    push <Long> (reg.pc, error);
    if (error) return;

    // Jump to new address
    reg.pc = ea;

    queue.irc = readM<MEM_PROG, Word>(ea);
    prefetch<POLLIPL>();
}